

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

void bloaty::anon_unknown_0::ReadELFSymbols
               (InputFile *file,RangeSink *sink,SymbolTable *table,bool disassemble)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  string_view range;
  string_view range_00;
  string_view range_01;
  string_view range_02;
  string_view label;
  string_view data;
  string_view label_00;
  string_view label_01;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  Arg *a0;
  string_view sVar7;
  string_view format;
  string_view data_00;
  string_view data_01;
  string_view label_02;
  MemberReader reader;
  MemberFile member;
  DisassemblyInfo info;
  ElfFile elf;
  size_t in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  char *pcVar8;
  string local_248;
  MemberFile local_220;
  anon_class_40_6_17eaf085 local_1e0;
  DisassemblyInfo local_1b8;
  ElfFile local_130;
  
  data_00._M_str = (char *)table;
  data_00._M_len = (size_t)(file->data_)._M_str;
  bVar3 = IsObjectFile((anon_unknown_0 *)(file->data_)._M_len,data_00);
  local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl + 8);
  local_1b8.text._M_len = 0;
  local_1b8.text._M_str = (char *)0x0;
  uVar4 = 0;
  local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8.symbol_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_1b8.symbol_map.file_map.mappings_._M_t._M_impl + 8);
  local_1b8.symbol_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_1b8.symbol_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1b8.symbol_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8.symbol_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b8.symbol_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8.symbol_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e0.capstone_available = ReadElfArchMode(file,&local_1b8.arch,&local_1b8.mode);
  local_1e0.infop = &local_1b8;
  uVar1 = (file->data_)._M_len;
  local_1e0.is_object = bVar3;
  local_1e0.sink = sink;
  local_1e0.disassemble = disassemble;
  local_1e0.table = table;
  if (uVar1 < 8) {
    Throw("region out-of-bounds",0x5d);
  }
  a0 = (Arg *)(file->data_)._M_str;
  if ((a0->piece_)._M_len == 0xa3e686372613c21) {
    local_248.field_2._8_8_ = &(a0->piece_)._M_str;
    local_248.field_2._M_allocated_capacity = uVar1 - 8;
    local_220.filename._M_len = 0;
    local_220.filename._M_str = (char *)0x0;
    local_220.header._M_len = 0;
    local_220.header._M_str = (char *)0x0;
    local_220.contents._M_len = 0;
    local_220.contents._M_str = (char *)0x0;
    local_248._M_dataplus._M_p = (char *)0x0;
    local_248._M_string_length = 0;
    range._M_str = in_stack_fffffffffffffdb0;
    range._M_len = in_stack_fffffffffffffda8;
    label_02._M_str = (char *)a0;
    label_02._M_len = 8;
    MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0xc,(RangeSink *)"[AR Headers]",label_02,range)
    ;
    bVar3 = ArFile::MemberReader::ReadMember((MemberReader *)&local_248,&local_220);
    if (bVar3) {
      pcVar8 = (char *)0x0;
      do {
        label._M_str = local_220.header._M_str;
        label._M_len = local_220.header._M_len;
        range_00._M_str = pcVar8;
        range_00._M_len = in_stack_fffffffffffffda8;
        pcVar5 = (char *)local_220.header._M_len;
        pcVar6 = local_220.header._M_str;
        MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0xc,(RangeSink *)"[AR Headers]",label,
                          range_00);
        if (local_220.file_type == kSymbolTable) {
          pcVar6 = (char *)0x11;
          pcVar5 = "[AR Symbol Table]";
LAB_00193345:
          label_01._M_str = local_220.contents._M_str;
          label_01._M_len = local_220.contents._M_len;
          range_01._M_str = pcVar8;
          range_01._M_len = in_stack_fffffffffffffda8;
          MaybeAddFileRange((anon_unknown_0 *)sink,pcVar6,(RangeSink *)pcVar5,label_01,range_01);
        }
        else {
          if (local_220.file_type == kLongFilenameTable) {
            pcVar6 = (char *)0xc;
            pcVar5 = "[AR Headers]";
            goto LAB_00193345;
          }
          if (local_220.file_type == kNormal) {
            label_00._M_str = local_220.contents._M_str;
            label_00._M_len = local_220.contents._M_len;
            data._M_str = local_220.contents._M_str;
            data._M_len = local_220.contents._M_len;
            ElfFile::ElfFile(&local_130,data);
            if (local_130.ok_ == true) {
              sVar7._M_str = pcVar5;
              sVar7._M_len = (size_t)pcVar8;
              ReadELFSymbols::anon_class_40_6_17eaf085::operator()
                        (&local_1e0,&local_130,sVar7,(uint64_t)pcVar6);
              pcVar8 = pcVar8 + local_130.section_count_;
            }
            else {
              range_02._M_str = pcVar8;
              range_02._M_len = in_stack_fffffffffffffda8;
              MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0x18,
                                (RangeSink *)"[AR Non-ELF Member File]",label_00,range_02);
            }
          }
        }
        bVar3 = ArFile::MemberReader::ReadMember((MemberReader *)&local_248,&local_220);
      } while (bVar3);
    }
  }
  else {
    data_01._M_str = (char *)a0;
    data_01._M_len = uVar1;
    ElfFile::ElfFile(&local_130,data_01);
    if (local_130.ok_ == false) {
      local_220.filename._M_len = (size_t)(file->filename_)._M_dataplus._M_p;
      local_220._0_8_ = (file->filename_)._M_string_length;
      format._M_str = (char *)&local_220;
      format._M_len = (size_t)"Not an ELF or Archive file: $0";
      absl::Substitute_abi_cxx11_(&local_248,(absl *)0x1e,format,a0);
      Throw(local_248._M_dataplus._M_p,0x2e2);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    ReadELFSymbols::anon_class_40_6_17eaf085::operator()
              (&local_1e0,&local_130,(string_view)(auVar2 << 0x40),(uint64_t)a0);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
               *)&local_1b8.symbol_map.file_map);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
               *)&local_1b8.symbol_map);
  return;
}

Assistant:

static void ReadELFSymbols(const InputFile& file, RangeSink* sink,
                           SymbolTable* table, bool disassemble) {
  bool is_object = IsObjectFile(file.data());
  DisassemblyInfo info;
  DisassemblyInfo* infop = &info;
  bool capstone_available = ReadElfArchMode(file, &info.arch, &info.mode);

  ForEachElf(
      file, sink,
      [=](const ElfFile& elf, string_view /*filename*/, uint64_t index_base) {
        for (Elf64_Xword i = 1; i < elf.section_count(); i++) {
          ElfFile::Section section;
          elf.ReadSection(i, &section);

          if (section.header().sh_type != SHT_SYMTAB) {
            continue;
          }

          Elf64_Word symbol_count = section.GetEntryCount();

          // Find the corresponding section where the strings for the symbol
          // table can be found.
          ElfFile::Section strtab_section;
          elf.ReadSection(section.header().sh_link, &strtab_section);
          if (strtab_section.header().sh_type != SHT_STRTAB) {
            THROW("symtab section pointed to non-strtab section");
          }

          for (Elf64_Word i = 1; i < symbol_count; i++) {
            Elf64_Sym sym;

            section.ReadSymbol(i, &sym, nullptr);

            if (ELF64_ST_TYPE(sym.st_info) == STT_SECTION) {
              continue;
            }

            if (sym.st_shndx == STN_UNDEF) {
              continue;
            }

            if (sym.st_size == 0) {
              // Maybe try to refine?  See ReadELFSectionsRefineSymbols below.
              continue;
            }

            string_view name = strtab_section.ReadString(sym.st_name);
            uint64_t full_addr =
                ToVMAddr(sym.st_value, index_base + sym.st_shndx, is_object);
            if (sink && !(capstone_available && disassemble)) {
              sink->AddVMRangeAllowAlias(
                  "elf_symbols", full_addr, sym.st_size,
                  ItaniumDemangle(name, sink->data_source()));
            }
            if (table) {
              table->insert(
                  std::make_pair(name, std::make_pair(full_addr, sym.st_size)));
            }
            if (capstone_available && disassemble &&
                ELF64_ST_TYPE(sym.st_info) == STT_FUNC) {
              if (verbose_level > 1) {
                printf("Disassembling function: %s\n", name.data());
              }
              // TODO(brandonvu) Continue if VM pointer cannot be translated. Issue #315
              uint64_t unused;
              if (!sink->Translator()->vm_map.Translate(full_addr, &unused)) {
                WARN("Can't translate VM pointer ($0) to file", full_addr);
                continue;
              }
              infop->text = sink->TranslateVMToFile(full_addr).substr(0, sym.st_size);
              infop->start_address = full_addr;
              DisassembleFindReferences(*infop, sink);
            }
          }
        }
      });
}